

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SampleScene.h
# Opt level: O0

void __thiscall
SampleScene<unsigned_int,_ColorShader,_TextureShader,_myTexture>::SampleScene
          (SampleScene<unsigned_int,_ColorShader,_TextureShader,_myTexture> *this,myTexture *texture
          )

{
  void *__dest;
  Vector3 *in_RDI;
  double in_stack_fffffffffffff3e8;
  SimpleMesh<SimpleVertex> *in_stack_fffffffffffff3f0;
  Camera *in_stack_fffffffffffff3f8;
  Scene<unsigned_int> *in_stack_fffffffffffff400;
  vector<SimpleVertex,_std::allocator<SimpleVertex>_> *in_stack_fffffffffffff408;
  SimpleMesh<SimpleVertex> *in_stack_fffffffffffff410;
  allocator_type *in_stack_fffffffffffff418;
  vector<SimpleMesh<SimpleVertex>,_std::allocator<SimpleMesh<SimpleVertex>_>_>
  *in_stack_fffffffffffff420;
  initializer_list<SimpleMesh<SimpleVertex>_> in_stack_fffffffffffff428;
  Object<SimpleMesh<SimpleVertex>,_SimpleVertex,_ColorShader,_myTexture> *o;
  Scene<unsigned_int> *local_b80;
  __uniq_ptr_impl<DedicatedPipeline<unsigned_int>,_std::default_delete<DedicatedPipeline<unsigned_int>_>_>
  *local_b58;
  __uniq_ptr_impl<DedicatedPipeline<unsigned_int>,_std::default_delete<DedicatedPipeline<unsigned_int>_>_>
  *local_b30;
  Vector3 *up_vector;
  Vector3 *position;
  double y;
  double x;
  SimpleVertex *this_00;
  Camera *this_01;
  myTexture *in_stack_fffffffffffff568;
  ColorShader *in_stack_fffffffffffff570;
  vector<SimpleMesh<SimpleVertex>,_std::allocator<SimpleMesh<SimpleVertex>_>_>
  *in_stack_fffffffffffff578;
  Object<SimpleMesh<SimpleVertex>,_SimpleVertex,_ColorShader,_myTexture> *in_stack_fffffffffffff580;
  Vector3 local_a68;
  undefined1 *local_a48;
  undefined1 local_a40 [56];
  double local_a08;
  __uniq_ptr_impl<DedicatedPipeline<unsigned_int>,_std::default_delete<DedicatedPipeline<unsigned_int>_>_>
  *local_9e0;
  __uniq_ptr_impl<DedicatedPipeline<unsigned_int>,_std::default_delete<DedicatedPipeline<unsigned_int>_>_>
  local_9d8 [6];
  __uniq_ptr_impl<DedicatedPipeline<unsigned_int>,_std::default_delete<DedicatedPipeline<unsigned_int>_>_>
  local_9a8;
  pointer local_9a0;
  __uniq_ptr_impl<DedicatedPipeline<unsigned_int>,_std::default_delete<DedicatedPipeline<unsigned_int>_>_>
  *local_978;
  __uniq_ptr_impl<DedicatedPipeline<unsigned_int>,_std::default_delete<DedicatedPipeline<unsigned_int>_>_>
  local_970 [6];
  unique_ptr<DedicatedPipeline<unsigned_int>,_std::default_delete<DedicatedPipeline<unsigned_int>_>_>
  local_940 [6];
  __uniq_ptr_impl<DedicatedPipeline<unsigned_int>,_std::default_delete<DedicatedPipeline<unsigned_int>_>_>
  local_910;
  undefined8 local_908;
  undefined1 local_8e0 [144];
  undefined1 *local_850;
  undefined8 local_848;
  TextureVertex local_820;
  TextureVertex local_7f8;
  TextureVertex local_7d0;
  TextureVertex local_7a8;
  TextureVertex local_780;
  TextureVertex local_758;
  TextureVertex local_730;
  TextureVertex local_708;
  TextureVertex local_6e0;
  TextureVertex local_6b8;
  TextureVertex local_690;
  TextureVertex local_668;
  TextureVertex local_640;
  TextureVertex local_618;
  TextureVertex local_5f0;
  TextureVertex local_5c8;
  TextureVertex local_5a0;
  TextureVertex local_578;
  TextureVertex local_550;
  TextureVertex local_528;
  TextureVertex local_500;
  TextureVertex local_4d8;
  TextureVertex local_4b0;
  TextureVertex local_488;
  TextureVertex *local_460;
  undefined8 local_458;
  undefined1 local_430 [168];
  undefined1 *local_388;
  undefined8 local_380;
  SimpleVertex local_358;
  SimpleVertex local_338;
  SimpleVertex local_318;
  SimpleVertex local_2f8;
  SimpleVertex local_2d8;
  SimpleVertex local_2b8;
  SimpleVertex local_298;
  SimpleVertex local_278;
  SimpleVertex local_258;
  SimpleVertex *local_238;
  undefined8 local_230;
  Vector3 local_209 [6];
  void *local_178;
  undefined8 local_170;
  undefined1 local_139 [33];
  SimpleVertex local_118;
  SimpleVertex local_f8;
  SimpleVertex local_d8;
  SimpleVertex local_b8;
  SimpleVertex local_98;
  SimpleVertex local_78;
  SimpleVertex local_58;
  SimpleVertex *local_38;
  undefined8 local_30;
  
  this_00 = (SimpleVertex *)(local_139 + 1);
  x = 1.0;
  y = -1.0;
  position = in_RDI;
  SimpleVertex::SimpleVertex(this_00,1.0,1.0,-1.0,0xff0000);
  SimpleVertex::SimpleVertex(&local_118,x,y,y,0xffff00);
  SimpleVertex::SimpleVertex(&local_f8,x,x,x,0xff00ff);
  SimpleVertex::SimpleVertex(&local_d8,x,y,x,0xff);
  SimpleVertex::SimpleVertex(&local_b8,y,x,y,0xffff);
  SimpleVertex::SimpleVertex(&local_98,y,y,y,0xff00);
  SimpleVertex::SimpleVertex(&local_78,y,x,x,0x80ff00);
  SimpleVertex::SimpleVertex(&local_58,y,y,x,0x808080);
  local_30 = 8;
  this_01 = (Camera *)local_139;
  local_38 = this_00;
  std::allocator<SimpleVertex>::allocator((allocator<SimpleVertex> *)0x1045c4);
  std::vector<SimpleVertex,_std::allocator<SimpleVertex>_>::vector
            ((vector<SimpleVertex,_std::allocator<SimpleVertex>_> *)in_stack_fffffffffffff420,
             (initializer_list<SimpleVertex>)in_stack_fffffffffffff428,
             (allocator_type *)in_stack_fffffffffffff418);
  __dest = (void *)((long)&local_209[0].x + 1);
  memcpy(__dest,&DAT_0011a014,0x90);
  local_170 = 0xc;
  up_vector = local_209;
  local_178 = __dest;
  std::allocator<std::array<int,_3UL>_>::allocator((allocator<std::array<int,_3UL>_> *)0x10463d);
  std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::vector
            ((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
             in_stack_fffffffffffff420,
             (initializer_list<std::array<int,_3UL>_>)in_stack_fffffffffffff428,
             (allocator_type *)in_stack_fffffffffffff418);
  SimpleMesh<SimpleVertex>::SimpleMesh
            (in_stack_fffffffffffff410,in_stack_fffffffffffff408,
             (vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
             in_stack_fffffffffffff400);
  std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::~vector
            ((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
             in_stack_fffffffffffff400);
  std::allocator<std::array<int,_3UL>_>::~allocator((allocator<std::array<int,_3UL>_> *)0x10469d);
  std::vector<SimpleVertex,_std::allocator<SimpleVertex>_>::~vector
            ((vector<SimpleVertex,_std::allocator<SimpleVertex>_> *)in_stack_fffffffffffff400);
  std::allocator<SimpleVertex>::~allocator((allocator<SimpleVertex> *)0x1046b7);
  SimpleVertex::SimpleVertex(&local_358,1.0,1.0,-1.0,0xff0000);
  SimpleVertex::SimpleVertex(&local_338,1.0,-1.0,-1.0,0xffff00);
  SimpleVertex::SimpleVertex(&local_318,1.0,1.0,1.0,0xff00ff);
  SimpleVertex::SimpleVertex(&local_2f8,1.0,-1.0,1.0,0xff);
  SimpleVertex::SimpleVertex(&local_2d8,-1.0,1.0,-1.0,0xffff);
  SimpleVertex::SimpleVertex(&local_2b8,-1.0,-1.0,-1.0,0xff00);
  SimpleVertex::SimpleVertex(&local_298,-1.0,1.0,1.0,0x80ff00);
  SimpleVertex::SimpleVertex(&local_278,-1.0,-1.0,1.0,0x808080);
  SimpleVertex::SimpleVertex(&local_258,0.0,2.0,0.0,0xad0040);
  local_238 = &local_358;
  local_230 = 9;
  std::allocator<SimpleVertex>::allocator((allocator<SimpleVertex> *)0x10484c);
  std::vector<SimpleVertex,_std::allocator<SimpleVertex>_>::vector
            ((vector<SimpleVertex,_std::allocator<SimpleVertex>_> *)in_stack_fffffffffffff420,
             (initializer_list<SimpleVertex>)in_stack_fffffffffffff428,
             (allocator_type *)in_stack_fffffffffffff418);
  memcpy(local_430,&DAT_0011a0a4,0xa8);
  local_380 = 0xe;
  local_388 = local_430;
  std::allocator<std::array<int,_3UL>_>::allocator((allocator<std::array<int,_3UL>_> *)0x1048c5);
  std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::vector
            ((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
             in_stack_fffffffffffff420,
             (initializer_list<std::array<int,_3UL>_>)in_stack_fffffffffffff428,
             (allocator_type *)in_stack_fffffffffffff418);
  SimpleMesh<SimpleVertex>::SimpleMesh
            (in_stack_fffffffffffff410,in_stack_fffffffffffff408,
             (vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
             in_stack_fffffffffffff400);
  std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::~vector
            ((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
             in_stack_fffffffffffff400);
  std::allocator<std::array<int,_3UL>_>::~allocator((allocator<std::array<int,_3UL>_> *)0x104925);
  std::vector<SimpleVertex,_std::allocator<SimpleVertex>_>::~vector
            ((vector<SimpleVertex,_std::allocator<SimpleVertex>_> *)in_stack_fffffffffffff400);
  std::allocator<SimpleVertex>::~allocator((allocator<SimpleVertex> *)0x10493f);
  TextureVertex::TextureVertex(&local_820,0.0,0.0,0.0,0.0,0.0);
  TextureVertex::TextureVertex(&local_7f8,0.0,0.0,0.0,1.0,1.0);
  TextureVertex::TextureVertex(&local_7d0,0.0,0.0,0.0,1.0,0.0);
  TextureVertex::TextureVertex(&local_7a8,0.0,0.0,1.0,1.0,0.0);
  TextureVertex::TextureVertex(&local_780,0.0,0.0,1.0,0.0,1.0);
  TextureVertex::TextureVertex(&local_758,0.0,0.0,1.0,0.0,0.0);
  TextureVertex::TextureVertex(&local_730,0.0,1.0,0.0,0.0,1.0);
  TextureVertex::TextureVertex(&local_708,0.0,1.0,0.0,1.0,1.0);
  TextureVertex::TextureVertex(&local_6e0,0.0,1.0,0.0,1.0,1.0);
  TextureVertex::TextureVertex(&local_6b8,0.0,1.0,1.0,1.0,1.0);
  TextureVertex::TextureVertex(&local_690,0.0,1.0,1.0,0.0,1.0);
  TextureVertex::TextureVertex(&local_668,0.0,1.0,1.0,0.0,1.0);
  TextureVertex::TextureVertex(&local_640,1.0,0.0,0.0,1.0,0.0);
  TextureVertex::TextureVertex(&local_618,1.0,0.0,0.0,0.0,0.0);
  TextureVertex::TextureVertex(&local_5f0,1.0,0.0,0.0,1.0,0.0);
  TextureVertex::TextureVertex(&local_5c8,1.0,0.0,1.0,0.0,0.0);
  TextureVertex::TextureVertex(&local_5a0,1.0,0.0,1.0,0.0,0.0);
  TextureVertex::TextureVertex(&local_578,1.0,0.0,1.0,1.0,0.0);
  TextureVertex::TextureVertex(&local_550,1.0,1.0,0.0,0.0,1.0);
  TextureVertex::TextureVertex(&local_528,1.0,1.0,0.0,1.0,1.0);
  TextureVertex::TextureVertex(&local_500,1.0,1.0,0.0,1.0,0.0);
  TextureVertex::TextureVertex(&local_4d8,1.0,1.0,1.0,0.0,1.0);
  TextureVertex::TextureVertex(&local_4b0,1.0,1.0,1.0,0.0,0.0);
  TextureVertex::TextureVertex(&local_488,1.0,1.0,1.0,1.0,1.0);
  local_460 = &local_820;
  local_458 = 0x18;
  std::allocator<TextureVertex>::allocator((allocator<TextureVertex> *)0x104cc7);
  std::vector<TextureVertex,_std::allocator<TextureVertex>_>::vector
            ((vector<TextureVertex,_std::allocator<TextureVertex>_> *)in_stack_fffffffffffff420,
             (initializer_list<TextureVertex>)in_stack_fffffffffffff428,
             (allocator_type *)in_stack_fffffffffffff418);
  memcpy(local_8e0,&DAT_0011a14c,0x90);
  local_848 = 0xc;
  local_850 = local_8e0;
  std::allocator<std::array<int,_3UL>_>::allocator((allocator<std::array<int,_3UL>_> *)0x104d40);
  std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::vector
            ((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
             in_stack_fffffffffffff420,
             (initializer_list<std::array<int,_3UL>_>)in_stack_fffffffffffff428,
             (allocator_type *)in_stack_fffffffffffff418);
  SimpleMesh<TextureVertex>::SimpleMesh
            ((SimpleMesh<TextureVertex> *)in_stack_fffffffffffff410,
             (vector<TextureVertex,_std::allocator<TextureVertex>_> *)in_stack_fffffffffffff408,
             (vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
             in_stack_fffffffffffff400);
  std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::~vector
            ((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
             in_stack_fffffffffffff400);
  std::allocator<std::array<int,_3UL>_>::~allocator((allocator<std::array<int,_3UL>_> *)0x104da0);
  std::vector<TextureVertex,_std::allocator<TextureVertex>_>::~vector
            ((vector<TextureVertex,_std::allocator<TextureVertex>_> *)in_stack_fffffffffffff400);
  std::allocator<TextureVertex>::~allocator((allocator<TextureVertex> *)0x104dba);
  local_978 = local_970;
  SimpleMesh<SimpleVertex>::SimpleMesh
            ((SimpleMesh<SimpleVertex> *)in_stack_fffffffffffff400,
             (SimpleMesh<SimpleVertex> *)in_stack_fffffffffffff3f8);
  local_978 = (__uniq_ptr_impl<DedicatedPipeline<unsigned_int>,_std::default_delete<DedicatedPipeline<unsigned_int>_>_>
               *)local_940;
  SimpleMesh<SimpleVertex>::SimpleMesh
            ((SimpleMesh<SimpleVertex> *)in_stack_fffffffffffff400,
             (SimpleMesh<SimpleVertex> *)in_stack_fffffffffffff3f8);
  local_910._M_t.
  super__Tuple_impl<0UL,_DedicatedPipeline<unsigned_int>_*,_std::default_delete<DedicatedPipeline<unsigned_int>_>_>
  .super__Head_base<0UL,_DedicatedPipeline<unsigned_int>_*,_false>._M_head_impl =
       (tuple<DedicatedPipeline<unsigned_int>_*,_std::default_delete<DedicatedPipeline<unsigned_int>_>_>
        )local_970;
  local_908 = 2;
  std::allocator<SimpleMesh<SimpleVertex>_>::allocator
            ((allocator<SimpleMesh<SimpleVertex>_> *)0x104e3e);
  std::vector<SimpleMesh<SimpleVertex>,_std::allocator<SimpleMesh<SimpleVertex>_>_>::vector
            (in_stack_fffffffffffff420,in_stack_fffffffffffff428,in_stack_fffffffffffff418);
  Object<SimpleMesh<SimpleVertex>,_SimpleVertex,_ColorShader,_myTexture>::Object
            (in_stack_fffffffffffff580,in_stack_fffffffffffff578,in_stack_fffffffffffff570,
             in_stack_fffffffffffff568);
  std::vector<SimpleMesh<SimpleVertex>,_std::allocator<SimpleMesh<SimpleVertex>_>_>::~vector
            ((vector<SimpleMesh<SimpleVertex>,_std::allocator<SimpleMesh<SimpleVertex>_>_> *)
             in_stack_fffffffffffff400);
  std::allocator<SimpleMesh<SimpleVertex>_>::~allocator
            ((allocator<SimpleMesh<SimpleVertex>_> *)0x104ea6);
  local_b30 = &local_910;
  do {
    local_b30 = local_b30 + -6;
    SimpleMesh<SimpleVertex>::~SimpleMesh(in_stack_fffffffffffff3f0);
  } while (local_b30 != local_970);
  local_9e0 = local_9d8;
  SimpleMesh<TextureVertex>::SimpleMesh
            ((SimpleMesh<TextureVertex> *)in_stack_fffffffffffff400,
             (SimpleMesh<TextureVertex> *)in_stack_fffffffffffff3f8);
  local_9a8._M_t.
  super__Tuple_impl<0UL,_DedicatedPipeline<unsigned_int>_*,_std::default_delete<DedicatedPipeline<unsigned_int>_>_>
  .super__Head_base<0UL,_DedicatedPipeline<unsigned_int>_*,_false>._M_head_impl =
       (tuple<DedicatedPipeline<unsigned_int>_*,_std::default_delete<DedicatedPipeline<unsigned_int>_>_>
        )local_9d8;
  local_9a0 = (pointer)0x1;
  std::allocator<SimpleMesh<TextureVertex>_>::allocator
            ((allocator<SimpleMesh<TextureVertex>_> *)0x104f5d);
  std::vector<SimpleMesh<TextureVertex>,_std::allocator<SimpleMesh<TextureVertex>_>_>::vector
            ((vector<SimpleMesh<TextureVertex>,_std::allocator<SimpleMesh<TextureVertex>_>_> *)
             in_stack_fffffffffffff420,
             (initializer_list<SimpleMesh<TextureVertex>_>)in_stack_fffffffffffff428,
             (allocator_type *)in_stack_fffffffffffff418);
  Object<SimpleMesh<TextureVertex>,_TextureVertex,_TextureShader,_myTexture>::Object
            ((Object<SimpleMesh<TextureVertex>,_TextureVertex,_TextureShader,_myTexture> *)
             in_stack_fffffffffffff580,
             (vector<SimpleMesh<TextureVertex>,_std::allocator<SimpleMesh<TextureVertex>_>_> *)
             in_stack_fffffffffffff578,(TextureShader *)in_stack_fffffffffffff570,
             in_stack_fffffffffffff568);
  std::vector<SimpleMesh<TextureVertex>,_std::allocator<SimpleMesh<TextureVertex>_>_>::~vector
            ((vector<SimpleMesh<TextureVertex>,_std::allocator<SimpleMesh<TextureVertex>_>_> *)
             in_stack_fffffffffffff400);
  std::allocator<SimpleMesh<TextureVertex>_>::~allocator
            ((allocator<SimpleMesh<TextureVertex>_> *)0x104fc5);
  local_b58 = &local_9a8;
  do {
    local_b58 = local_b58 + -6;
    SimpleMesh<TextureVertex>::~SimpleMesh((SimpleMesh<TextureVertex> *)in_stack_fffffffffffff3f0);
  } while (local_b58 != local_9d8);
  local_a48 = local_a40;
  SimpleMesh<SimpleVertex>::SimpleMesh
            ((SimpleMesh<SimpleVertex> *)in_stack_fffffffffffff400,
             (SimpleMesh<SimpleVertex> *)in_stack_fffffffffffff3f8);
  local_a40._48_8_ = local_a40;
  local_a08 = 4.94065645841247e-324;
  std::allocator<SimpleMesh<SimpleVertex>_>::allocator
            ((allocator<SimpleMesh<SimpleVertex>_> *)0x105078);
  std::vector<SimpleMesh<SimpleVertex>,_std::allocator<SimpleMesh<SimpleVertex>_>_>::vector
            (in_stack_fffffffffffff420,in_stack_fffffffffffff428,in_stack_fffffffffffff418);
  Object<SimpleMesh<SimpleVertex>,_SimpleVertex,_ColorShader,_myTexture>::Object
            (in_stack_fffffffffffff580,in_stack_fffffffffffff578,in_stack_fffffffffffff570,
             in_stack_fffffffffffff568);
  std::vector<SimpleMesh<SimpleVertex>,_std::allocator<SimpleMesh<SimpleVertex>_>_>::~vector
            ((vector<SimpleMesh<SimpleVertex>,_std::allocator<SimpleMesh<SimpleVertex>_>_> *)
             in_stack_fffffffffffff400);
  std::allocator<SimpleMesh<SimpleVertex>_>::~allocator
            ((allocator<SimpleMesh<SimpleVertex>_> *)0x1050e0);
  local_b80 = (Scene<unsigned_int> *)(local_a40 + 0x30);
  do {
    local_b80 = (Scene<unsigned_int> *)&local_b80[-1].camera.verticalFieldOfView;
    SimpleMesh<SimpleVertex>::~SimpleMesh(in_stack_fffffffffffff3f0);
  } while (local_b80 != (Scene<unsigned_int> *)local_a40);
  o = (Object<SimpleMesh<SimpleVertex>,_SimpleVertex,_ColorShader,_myTexture> *)(position + 0x12);
  Vector3::Vector3(&local_a68,0.0,0.0,0.0);
  Vector3::Vector3((Vector3 *)&stack0xfffffffffffff580,0.0,0.0,-3.5);
  Vector3::Vector3((Vector3 *)&stack0xfffffffffffff568,0.0,1.0,0.0);
  Camera::Camera(this_01,(double)this_00,x,y,position,in_RDI,up_vector);
  Scene<unsigned_int>::Scene(in_stack_fffffffffffff400,in_stack_fffffffffffff3f8);
  Object<SimpleMesh<SimpleVertex>,_SimpleVertex,_ColorShader,_myTexture>::setPosition
            ((Object<SimpleMesh<SimpleVertex>,_SimpleVertex,_ColorShader,_myTexture> *)
             in_stack_fffffffffffff400,(double)in_stack_fffffffffffff3f8,
             (double)in_stack_fffffffffffff3f0,in_stack_fffffffffffff3e8);
  Object<SimpleMesh<SimpleVertex>,_SimpleVertex,_ColorShader,_myTexture>::setScale
            ((Object<SimpleMesh<SimpleVertex>,_SimpleVertex,_ColorShader,_myTexture> *)
             in_stack_fffffffffffff400,(double)in_stack_fffffffffffff3f8,
             (double)in_stack_fffffffffffff3f0,in_stack_fffffffffffff3e8);
  Object<SimpleMesh<TextureVertex>,_TextureVertex,_TextureShader,_myTexture>::setPosition
            ((Object<SimpleMesh<TextureVertex>,_TextureVertex,_TextureShader,_myTexture> *)
             in_stack_fffffffffffff400,(double)in_stack_fffffffffffff3f8,
             (double)in_stack_fffffffffffff3f0,in_stack_fffffffffffff3e8);
  Object<SimpleMesh<SimpleVertex>,_SimpleVertex,_ColorShader,_myTexture>::setPosition
            ((Object<SimpleMesh<SimpleVertex>,_SimpleVertex,_ColorShader,_myTexture> *)
             in_stack_fffffffffffff400,(double)in_stack_fffffffffffff3f8,
             (double)in_stack_fffffffffffff3f0,in_stack_fffffffffffff3e8);
  Object<SimpleMesh<SimpleVertex>,_SimpleVertex,_ColorShader,_myTexture>::setScale
            ((Object<SimpleMesh<SimpleVertex>,_SimpleVertex,_ColorShader,_myTexture> *)
             in_stack_fffffffffffff400,(double)in_stack_fffffffffffff3f8,
             (double)in_stack_fffffffffffff3f0,in_stack_fffffffffffff3e8);
  Scene<unsigned_int>::add<SimpleMesh<SimpleVertex>,SimpleVertex,ColorShader,myTexture>(local_b80,o)
  ;
  Scene<unsigned_int>::add<SimpleMesh<TextureVertex>,TextureVertex,TextureShader,myTexture>
            (local_b80,
             (Object<SimpleMesh<TextureVertex>,_TextureVertex,_TextureShader,_myTexture> *)o);
  Scene<unsigned_int>::add<SimpleMesh<SimpleVertex>,SimpleVertex,ColorShader,myTexture>(local_b80,o)
  ;
  return;
}

Assistant:

explicit SampleScene(Texture &...texture) : colorCube({colorMesh,secondColorMesh}, FirstShader(), texture...),
                                                textureCube({textureMesh}, SecondShader(), texture...),
                                                anotherColorCube({colorMesh}, FirstShader(), texture...),
                                                camera(45.0, 0.1, 10, {0, 0, 0}, {0, 0, -3.5}),
                                                scene(camera) {

        // Sets position and scale of the cubes
        colorCube.setPosition(-1, 0, -3);
        colorCube.setScale(.5, .5, .5);
        textureCube.setPosition(1, 0, -3);
        anotherColorCube.setPosition(-5, 0, -8);
        anotherColorCube.setScale(1, .5, 1);

        // Adds the cubes to the scene
        scene.add(colorCube);
        scene.add(textureCube);
        scene.add(anotherColorCube);
    }